

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Node * __thiscall JSON::Parser::parseNode(Node *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  bool local_4c2;
  string local_478 [32];
  string local_458 [32];
  Node local_438;
  byte local_3d3;
  byte local_3d2;
  allocator local_3d1;
  string local_3d0 [39];
  byte local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  Node local_300;
  allocator local_299;
  string local_298 [32];
  string local_278 [32];
  string local_258 [8];
  string tokenValue;
  string local_238 [32];
  string local_218 [32];
  Node local_1f8;
  string local_198 [32];
  string local_178 [32];
  Node local_158;
  Node local_f8;
  Node local_88;
  TokenType local_24;
  int local_20;
  TokenType type;
  int startPos;
  Parser *this_local;
  Node *node;
  
  type._3_1_ = 0;
  _startPos = this;
  this_local = (Parser *)__return_storage_ptr__;
  Node::Node(__return_storage_ptr__);
  local_20 = (this->currentToken).start;
  local_24 = (this->currentToken).type;
  if (local_24 == BRACES_START) {
    parseObjectExpression(&local_88,this);
    Node::operator=(__return_storage_ptr__,&local_88);
    Node::~Node(&local_88);
  }
  else if (local_24 == BRACKETS_START) {
    parseArrayExpression(&local_f8,this);
    Node::operator=(__return_storage_ptr__,&local_f8);
    Node::~Node(&local_f8);
  }
  else if (local_24 == STRING) {
    std::__cxx11::string::string(local_178,(string *)NodeType::StringLiteral_abi_cxx11_);
    std::__cxx11::string::string(local_198,(string *)&(this->currentToken).value);
    Node::Node(&local_158,(string *)local_178,(string *)local_198,(this->currentToken).start,
               (this->currentToken).end);
    Node::operator=(__return_storage_ptr__,&local_158);
    Node::~Node(&local_158);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_178);
    next(this);
  }
  else if (local_24 == NUMBER) {
    std::__cxx11::string::string(local_218,(string *)NodeType::NumericLiteral_abi_cxx11_);
    std::__cxx11::string::string(local_238,(string *)&(this->currentToken).value);
    Node::Node(&local_1f8,(string *)local_218,(string *)local_238,(this->currentToken).start,
               (this->currentToken).end);
    Node::operator=(__return_storage_ptr__,&local_1f8);
    Node::~Node(&local_1f8);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string(local_218);
    next(this);
  }
  else if (local_24 == WORD) {
    std::__cxx11::string::string(local_258,(string *)&(this->currentToken).value);
    std::__cxx11::string::string(local_278,local_258);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"null",&local_299);
    bVar1 = stringEquals((string *)local_278,(string *)local_298);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    std::__cxx11::string::~string(local_278);
    if (bVar1) {
      std::__cxx11::string::string(local_320,(string *)NodeType::NullLiteral_abi_cxx11_);
      std::__cxx11::string::string(local_340,local_258);
      Node::Node(&local_300,(string *)local_320,(string *)local_340,(this->currentToken).start,
                 (this->currentToken).end);
      Node::operator=(__return_storage_ptr__,&local_300);
      Node::~Node(&local_300);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_320);
      next(this);
    }
    else {
      local_3a9 = 0;
      local_3d2 = 0;
      local_3d3 = 0;
      std::__cxx11::string::string(local_360,local_258);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"true",&local_381);
      bVar1 = stringEquals((string *)local_360,(string *)local_380);
      local_4c2 = true;
      if (!bVar1) {
        std::__cxx11::string::string(local_3a8,local_258);
        local_3a9 = 1;
        std::allocator<char>::allocator();
        local_3d2 = 1;
        std::__cxx11::string::string(local_3d0,"false",&local_3d1);
        local_3d3 = 1;
        local_4c2 = stringEquals((string *)local_3a8,(string *)local_3d0);
      }
      if ((local_3d3 & 1) != 0) {
        std::__cxx11::string::~string(local_3d0);
      }
      if ((local_3d2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      }
      if ((local_3a9 & 1) != 0) {
        std::__cxx11::string::~string(local_3a8);
      }
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
      std::__cxx11::string::~string(local_360);
      if (local_4c2 == false) {
        unexpected(this,&this->currentToken);
      }
      else {
        std::__cxx11::string::string(local_458,(string *)NodeType::BooleanLiteral_abi_cxx11_);
        std::__cxx11::string::string(local_478,local_258);
        Node::Node(&local_438,(string *)local_458,(string *)local_478,(this->currentToken).start,
                   (this->currentToken).end);
        Node::operator=(__return_storage_ptr__,&local_438);
        Node::~Node(&local_438);
        std::__cxx11::string::~string(local_478);
        std::__cxx11::string::~string(local_458);
        next(this);
      }
    }
    std::__cxx11::string::~string(local_258);
  }
  else {
    unexpected(this,&this->currentToken);
  }
  __return_storage_ptr__->start = local_20;
  __return_storage_ptr__->end = (this->lastToken).end;
  return __return_storage_ptr__;
}

Assistant:

Node Parser::parseNode() {
        Node node;
        int startPos = currentToken.start;
        TokenType type = currentToken.type;

        if (type == BRACES_START) {
            node = parseObjectExpression();
        } else if (type == BRACKETS_START) {
            node = parseArrayExpression();
        } else if (type == STRING) {
            node = Node(NodeType::StringLiteral, currentToken.value, currentToken.start, currentToken.end);
            next();
        } else if (type == NUMBER) {
            node = Node(NodeType::NumericLiteral, currentToken.value, currentToken.start, currentToken.end);
            next();
        } else if (type == WORD) {
            string tokenValue = currentToken.value;
            if (stringEquals(tokenValue, "null")) {
                node = Node(NodeType::NullLiteral, tokenValue, currentToken.start, currentToken.end);
                next();
            } else if (stringEquals(tokenValue, "true") || stringEquals(tokenValue, "false")) {
                node = Node(NodeType::BooleanLiteral, tokenValue, currentToken.start, currentToken.end);
                next();
            } else {
                unexpected(currentToken);
            }
        } else {
            unexpected(currentToken);
        }

        node.start = startPos;
        node.end = lastToken.end;

        return node;
    }